

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O3

bool __thiscall ON_Brep::IsValidTolerancesAndFlags(ON_Brep *this,ON_TextLog *text_log)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  long lVar6;
  char *format;
  ulong uVar7;
  ulong uVar8;
  
  uVar7 = (ulong)(this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
                 m_count;
  uVar1 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count;
  uVar2 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count;
  uVar3 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count;
  uVar4 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count;
  if (0 < (long)uVar7) {
    lVar6 = 0x34;
    uVar8 = 0;
    do {
      if ((*(int *)((long)&(((this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                             super_ON_ClassArray<ON_BrepVertex>.m_a)->super_ON_Point).
                           super_ON_Geometry.super_ON_Object._vptr_ON_Object + lVar6) != -1) &&
         (bVar5 = IsValidVertexTolerancesAndFlags(this,(int)uVar8,text_log), !bVar5)) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        format = "ON_Brep.m_V[%d] is invalid.\n";
        goto LAB_0040aad5;
      }
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + 0x58;
    } while (uVar7 != uVar8);
  }
  if (0 < (int)uVar1) {
    lVar6 = 0x4c;
    uVar8 = 0;
    do {
      if ((*(int *)((long)&(((ON_CurveProxy *)
                            (&(((this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                                super_ON_ClassArray<ON_BrepEdge>.m_a)->super_ON_CurveProxy).
                              m_real_curve_domain + -2))->super_ON_Curve).super_ON_Geometry.
                           super_ON_Object._vptr_ON_Object + lVar6) != -1) &&
         (bVar5 = IsValidEdgeTolerancesAndFlags(this,(int)uVar8,text_log), !bVar5)) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        format = "ON_Brep.m_E[%d] is invalid.\n";
        goto LAB_0040aad5;
      }
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + 0x88;
    } while (uVar1 != uVar8);
  }
  if (0 < (int)uVar4) {
    lVar6 = 0x2c;
    uVar8 = 0;
    do {
      if ((*(int *)((((this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>
                     .m_a)->m_face_uuid).Data4 + lVar6 + -0x5c) != -1) &&
         (bVar5 = IsValidFaceTolerancesAndFlags(this,(int)uVar8,text_log), !bVar5)) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        format = "ON_Brep.m_F[%d] is invalid.\n";
        goto LAB_0040aad5;
      }
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + 0xd8;
    } while (uVar4 != uVar8);
  }
  if (0 < (int)uVar2) {
    lVar6 = 0x4c;
    uVar8 = 0;
    do {
      if ((*(int *)((long)&(((ON_CurveProxy *)
                            (&(((this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                                super_ON_ClassArray<ON_BrepTrim>.m_a)->super_ON_CurveProxy).
                              m_real_curve_domain + -2))->super_ON_Curve).super_ON_Geometry.
                           super_ON_Object._vptr_ON_Object + lVar6) != -1) &&
         (bVar5 = IsValidTrimTolerancesAndFlags(this,(int)uVar8,text_log), !bVar5)) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        format = "ON_Brep.m_T[%d] is invalid.\n";
        goto LAB_0040aad5;
      }
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + 0xe8;
    } while (uVar2 != uVar8);
  }
  if (0 < (int)uVar3) {
    lVar6 = 0x1c;
    uVar8 = 0;
    do {
      if ((*(int *)((long)&(((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                             super_ON_ClassArray<ON_BrepLoop>.m_a)->super_ON_Geometry).
                           super_ON_Object._vptr_ON_Object + lVar6) != -1) &&
         (bVar5 = IsValidLoopTolerancesAndFlags(this,(int)uVar8,text_log), !bVar5)) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        format = "ON_Brep.m_L[%d] is invalid.\n";
LAB_0040aad5:
        ON_TextLog::Print(text_log,format,uVar8 & 0xffffffff);
        return false;
      }
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + 0x78;
    } while (uVar3 != uVar8);
  }
  return true;
}

Assistant:

bool
ON_Brep::IsValidTolerancesAndFlags( ON_TextLog* text_log ) const
{
  const int vertex_count  = m_V.Count();
  const int edge_count    = m_E.Count();
  const int trim_count    = m_T.Count();
  const int loop_count    = m_L.Count();
  const int face_count    = m_F.Count();

  int vi, ei, fi, ti, li;

  // check vertices
  for ( vi = 0; vi < vertex_count; vi++ ) {
    if ( m_V[vi].m_vertex_index == -1 )
      continue;
    if ( !IsValidVertexTolerancesAndFlags( vi, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_V[%d] is invalid.\n",vi);
      return false;
    }
  }

  // check edges
  for ( ei = 0; ei < edge_count; ei++ ) 
  {
    if ( m_E[ei].m_edge_index == -1 )
      continue;
    if ( !IsValidEdgeTolerancesAndFlags( ei, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_E[%d] is invalid.\n",ei);
      return false;
    }
  }

  // check faces
  for ( fi = 0; fi < face_count; fi++ ) 
  {
    if ( m_F[fi].m_face_index == -1 )
      continue;
    if ( !IsValidFaceTolerancesAndFlags( fi, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_F[%d] is invalid.\n",fi);
      return false;
    }
  }

  // check trims
  for ( ti = 0; ti < trim_count; ti++ )
  {
    if ( m_T[ti].m_trim_index == -1 )
      continue;
    if ( !IsValidTrimTolerancesAndFlags( ti, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_T[%d] is invalid.\n",ti);
      return false;
    }
  }

  // check loops
  for ( li = 0; li < loop_count; li++ )
  {
    if ( m_L[li].m_loop_index == -1 )
      continue;
    if ( !IsValidLoopTolerancesAndFlags( li, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_L[%d] is invalid.\n",li);
      return false;
    }
  }

  return true;
}